

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

void __thiscall
clip_model_loader::get_string(clip_model_loader *this,string *key,string *output,bool required)

{
  pointer pgVar1;
  undefined8 uVar2;
  runtime_error *this_00;
  byte in_CL;
  string *in_RDX;
  int i;
  unique_ptr<gguf_context,_gguf_context_deleter> *in_stack_ffffffffffffff60;
  allocator<char> local_71;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  string local_40 [32];
  int local_20;
  byte local_19;
  string *local_18;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  pgVar1 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get(in_stack_ffffffffffffff60);
  uVar2 = std::__cxx11::string::c_str();
  local_20 = gguf_find_key(pgVar1,uVar2);
  if (local_20 < 0) {
    if ((local_19 & 1) != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      std::runtime_error::runtime_error(this_00,local_40);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    pgVar1 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get(in_stack_ffffffffffffff60);
    gguf_get_val_str(pgVar1,(long)local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::__cxx11::string::operator=(local_18,(string *)&stack0xffffffffffffff90);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
    std::allocator<char>::~allocator(&local_71);
  }
  return;
}

Assistant:

void get_string(const std::string & key, std::string & output, bool required = true) {
        const int i = gguf_find_key(ctx_gguf.get(), key.c_str());
        if (i < 0) {
            if (required) throw std::runtime_error("Key not found: " + key);
            return;
        }
        output = std::string(gguf_get_val_str(ctx_gguf.get(), i));
    }